

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WheatsheafAndWheatsheafMeanWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar,
          int ensemble_id)

{
  allocator<mean_count> *this_00;
  pointer *this_01;
  bool *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  outkey2 oVar4;
  iterator iVar5;
  int iVar6;
  bool bVar7;
  mapped_type *pmVar8;
  reference pvVar9;
  reference ppVar10;
  reference piVar11;
  const_reference pvVar12;
  _Base_ptr this_02;
  size_type __n;
  reference __k;
  mapped_type *this_03;
  undefined4 in_register_0000000c;
  long *plVar13;
  OASIS_FLOAT OVar14;
  int in_stack_00000010;
  code *local_2a8;
  code *local_288;
  vector<int,_std::allocator<int>_> local_250;
  undefined4 local_234;
  undefined1 local_230 [8];
  vector<int,_std::allocator<int>_> fileIDs_1;
  vector<int,_std::allocator<int>_> fileIDs;
  value_type local_1f8;
  vector<mean_count,_std::allocator<mean_count>_> local_1d8;
  _Self local_1c0;
  _Self local_1b8;
  iterator it;
  map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
  *temp_map;
  pair<const_outkey2,_OutLosses> x_1;
  _Self local_168;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  iterator iStack_130;
  int sidx;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  pair<const_outkey2,_OutLosses> x;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  undefined1 local_d8 [8];
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> maxPeriodNo;
  undefined1 local_70 [4];
  int samplesize;
  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  int eptype_local;
  int epcalc_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  vector<int,_std::allocator<int>_> *handles_local;
  aggreports *this_local;
  
  items._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = eptype_tvar;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eptype;
  std::
  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::map((map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
         *)local_70);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_d8,&this->periodstoweighting_);
  if (in_stack_00000010 == 0) {
    pvVar9 = std::
             vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             ::operator[](this->out_loss_,1);
    __end2_1 = std::
               map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
               ::begin(pvVar9);
    local_168._M_node =
         (_Base_ptr)
         std::
         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
         ::end(pvVar9);
    while (bVar7 = std::operator!=(&__end2_1,&local_168), bVar7) {
      ppVar10 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end2_1);
      x_1.first.sidx = (int)(ppVar10->second).max_out_loss;
      x_1.first.summary_id = (ppVar10->first).sidx;
      oVar4 = ppVar10->first;
      x_1.first.period_no = (int)(ppVar10->second).agg_out_loss;
      plVar13 = (long *)((long)&x_1.first.period_no + CONCAT44(in_register_0000000c,epcalc));
      local_2a8 = (code *)GetOutLoss;
      if ((GetOutLoss & 1) != 0) {
        local_2a8 = *(code **)(*plVar13 + (GetOutLoss - 1));
      }
      OVar14 = (OASIS_FLOAT)(*local_2a8)(plVar13);
      FillWheatsheafItems(this,oVar4,
                          (map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                           *)local_70,OVar14,
                          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,
                          (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)local_d8);
      std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end2_1);
    }
  }
  else {
    pmVar8 = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ensembletosidx_,&stack0x00000010);
    std::vector<int,_std::allocator<int>_>::size(pmVar8);
    pvVar9 = std::
             vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             ::operator[](this->out_loss_,1);
    __end2 = std::
             map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
             ::begin(pvVar9);
    register0x00000000 =
         std::
         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
         ::end(pvVar9);
    while (bVar7 = std::operator!=(&__end2,(_Self *)&x.second.max_out_loss), bVar7) {
      ppVar10 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end2);
      x.first.sidx = (int)(ppVar10->second).max_out_loss;
      uVar2 = (ppVar10->first).summary_id;
      uVar3 = (ppVar10->first).period_no;
      oVar4.period_no = uVar3;
      oVar4.summary_id = uVar2;
      x.first._0_8_ = *(undefined8 *)&(ppVar10->first).sidx;
      pmVar8 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->ensembletosidx_,&stack0x00000010);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pmVar8);
      iStack_130 = std::vector<int,_std::allocator<int>_>::end(pmVar8);
      while (bVar7 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffed0), bVar7) {
        piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end3);
        iVar6 = x.first.summary_id;
        if (x.first.summary_id == *piVar11) {
          plVar13 = (long *)((long)&x.first.period_no + CONCAT44(in_register_0000000c,epcalc));
          local_288 = (code *)GetOutLoss;
          if ((GetOutLoss & 1) != 0) {
            local_288 = *(code **)(*plVar13 + (GetOutLoss - 1));
          }
          OVar14 = (OASIS_FLOAT)(*local_288)(plVar13);
          oVar4.sidx = iVar6;
          FillWheatsheafItems(this,oVar4,
                              (map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                               *)local_70,OVar14,
                              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count,
                              (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                               *)local_d8);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end2);
    }
  }
  it._M_node = (_Base_ptr)0x0;
  pbVar1 = this->outputFlags_;
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](handles,1);
  if ((pbVar1[*pvVar12] & 1U) != 0) {
    this_02 = (_Base_ptr)operator_new(0x30);
    memset(this_02,0,0x30);
    std::
    map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
    ::map((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
           *)this_02);
    it._M_node = this_02;
    local_1b8._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->summaryids_);
    while( true ) {
      local_1c0._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->summaryids_);
      bVar7 = std::operator!=(&local_1b8,&local_1c0);
      if (!bVar7) break;
      __n = std::vector<int,_std::allocator<int>_>::size(&this->returnperiods_);
      local_1f8.retperiod = 0.0;
      local_1f8.mean = 0.0;
      local_1f8.count = 0;
      local_1f8._20_4_ = 0;
      this_00 = (allocator<mean_count> *)
                ((long)&fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<mean_count>::allocator(this_00);
      std::vector<mean_count,_std::allocator<mean_count>_>::vector
                (&local_1d8,__n,&local_1f8,this_00);
      iVar5 = it;
      __k = std::_Rb_tree_const_iterator<int>::operator*(&local_1b8);
      this_03 = std::
                map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                              *)iVar5._M_node,__k);
      std::vector<mean_count,_std::allocator<mean_count>_>::operator=(this_03,&local_1d8);
      std::vector<mean_count,_std::allocator<mean_count>_>::~vector(&local_1d8);
      std::allocator<mean_count>::~allocator
                ((allocator<mean_count> *)
                 ((long)&fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::_Rb_tree_const_iterator<int>::operator++(&local_1b8);
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &fileIDs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pbVar1 = this->outputFlags_;
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](handles,0);
  if ((pbVar1[*pvVar12] & 1U) == 1) {
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](handles,0);
    GetFileIDs((vector<int,_std::allocator<int>_> *)local_230,this,*pvVar12,1);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_230);
  }
  WritePerSampleExceedanceProbabilityTable
            (this,(vector<int,_std::allocator<int>_> *)
                  &fileIDs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
             (map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
              *)local_70,(int)items._M_t._M_impl.super__Rb_tree_header._M_node_count,ensemble_id,
             (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_d8,(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                       *)it._M_node);
  pbVar1 = this->outputFlags_;
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](handles,1);
  if ((pbVar1[*pvVar12] & 1U) == 0) {
    local_234 = 1;
  }
  else {
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](handles,1);
    GetFileIDs(&local_250,this,*pvVar12,0);
    this_01 = &fileIDs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)this_01,&local_250);
    std::vector<int,_std::allocator<int>_>::~vector(&local_250);
    WriteWheatsheafMean(this,(vector<int,_std::allocator<int>_> *)this_01,
                        items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                        (int)items._M_t._M_impl.super__Rb_tree_header._M_node_count,ensemble_id,
                        (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                         *)it._M_node);
    iVar5 = it;
    if (it._M_node != (_Base_ptr)0x0) {
      std::
      map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
      ::~map((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
              *)it._M_node);
      operator_delete(iVar5._M_node);
    }
    it._M_node = (_Base_ptr)0x0;
    local_234 = 0;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &fileIDs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_d8);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~map((map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *)local_70);
  return;
}

Assistant:

void aggreports::WheatsheafAndWheatsheafMeanWithWeighting(
	const std::vector<int> handles, OASIS_FLOAT (OutLosses::*GetOutLoss)(),
	const int epcalc, const int eptype, const int eptype_tvar,
	int ensemble_id) {

  std::map<wheatkey, lossvec2> items;
  int samplesize;
  std::map<int, int> maxPeriodNo;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  if (ensemble_id != 0) {
    samplesize = (int)ensembletosidx_[ensemble_id].size();
    for (auto x : (*out_loss_)[SAMPLES]) {
      for (auto sidx : ensembletosidx_[ensemble_id]) {
	if (x.first.sidx == sidx) {
	  FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)(),
			      maxPeriodNo, unusedperiodstoweighting);
	}
      }
    }
  } else {
    samplesize = samplesize_;
    for (auto x : (*out_loss_)[SAMPLES]) {
      FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)(),
			  maxPeriodNo, unusedperiodstoweighting);
    }
  }

  // Map for Wheatsheaf mean - calculate Wheatsheaf mean at same time as
  // Wheatsheaf. There is no need to check for a return period file, as
  // this is checked earlier in aggreports::LoadPeriodsToWeighting().
  std::map<int, std::vector<mean_count>> *temp_map = nullptr;
  if (outputFlags_[handles[WHEATSHEAF_MEAN]]) {
    temp_map = new std::map<int, std::vector<mean_count>>();
    for (auto it = summaryids_.begin(); it != summaryids_.end(); ++it) {
      (*temp_map)[*it] = std::vector<mean_count>(returnperiods_.size(),
						 mean_count());
    }
  }


  std::vector<int> fileIDs;
  if (outputFlags_[handles[WHEATSHEAF]] == true) {
    std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF], PSEPT);
  }
  WritePerSampleExceedanceProbabilityTable(fileIDs, items, eptype, eptype_tvar,
					   unusedperiodstoweighting, temp_map);

  if (outputFlags_[handles[WHEATSHEAF_MEAN]] == false) return;

  fileIDs = GetFileIDs(handles[WHEATSHEAF_MEAN]);
  WriteWheatsheafMean(fileIDs, epcalc, eptype, eptype_tvar, temp_map);

  delete temp_map;   // tidy up
  temp_map = nullptr;

}